

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerResults.cpp
# Opt level: O0

void __thiscall
PS2KeyboardAnalyzerResults::GetCommandName
          (PS2KeyboardAnalyzerResults *this,char *returnstr,U64 code,double DeviceType)

{
  double DeviceType_local;
  U64 code_local;
  char *returnstr_local;
  PS2KeyboardAnalyzerResults *this_local;
  
  if ((DeviceType != 0.0) || (NAN(DeviceType))) {
    switch(code) {
    case 0xe6:
      sprintf(returnstr,"SET SCALING 1:1");
      break;
    case 0xe7:
      sprintf(returnstr,"SET SCALING TO 2:1");
      break;
    case 0xe8:
      sprintf(returnstr,"SET RESOLUTION");
      break;
    case 0xe9:
      sprintf(returnstr,"STATUS REQUEST");
      break;
    case 0xea:
      sprintf(returnstr,"SET STREAM MODE");
      break;
    case 0xeb:
      sprintf(returnstr,"READ DATA");
      break;
    case 0xec:
      sprintf(returnstr,"RESET WRAP MODE");
      break;
    default:
      sprintf(returnstr,"DATA FRAME");
      break;
    case 0xee:
      sprintf(returnstr,"SET WRAP MODE");
      break;
    case 0xf0:
      sprintf(returnstr,"SET REMOTE MODE");
      break;
    case 0xf2:
      sprintf(returnstr,"GET DEVICE ID");
      break;
    case 0xf3:
      sprintf(returnstr,"SET SAMPLE RATE");
      break;
    case 0xf4:
      sprintf(returnstr,"ENABLE DATA REPORTING");
      break;
    case 0xf5:
      sprintf(returnstr,"DISABLE DATA REPORTING");
      break;
    case 0xf6:
      sprintf(returnstr,"SET DEFAULTS");
      break;
    case 0xfe:
      sprintf(returnstr,"RESEND");
      break;
    case 0xff:
      sprintf(returnstr,"RESET MOUSE");
    }
  }
  else {
    switch(code) {
    case 0xed:
      sprintf(returnstr,"SET LEDs");
      break;
    case 0xee:
      sprintf(returnstr,"SEND ECHO");
      break;
    default:
      sprintf(returnstr,"DATA FRAME");
      break;
    case 0xf0:
      sprintf(returnstr,"SET SCANCODE");
      break;
    case 0xf2:
      sprintf(returnstr,"READ DEVICE ID");
      break;
    case 0xf3:
      sprintf(returnstr,"SET REPEAT");
      break;
    case 0xf4:
      sprintf(returnstr,"KEYBOARD ENABLE");
      break;
    case 0xf5:
      sprintf(returnstr,"KEYBOARD DISABLE");
      break;
    case 0xf6:
      sprintf(returnstr,"SET DEFAULTS");
      break;
    case 0xf7:
      sprintf(returnstr,"SET ALL KEYS REPEAT CODES");
      break;
    case 0xf8:
      sprintf(returnstr,"SET ALL KEYS MAKE, BREAK CODES");
      break;
    case 0xf9:
      sprintf(returnstr,"SET ALL KEYS MAKE CODES ONLY");
      break;
    case 0xfa:
      sprintf(returnstr,"SET ALL KEYS MAKE, BREAK, REPEAT CODES");
      break;
    case 0xfb:
      sprintf(returnstr,"SET KEY REPEAT CODES");
      break;
    case 0xfc:
      sprintf(returnstr,"SET KEY MAKE, BREAK CODES");
      break;
    case 0xfd:
      sprintf(returnstr,"SET KEY MAKE CODES ONLY");
      break;
    case 0xfe:
      sprintf(returnstr,"RESEND LAST DATA");
      break;
    case 0xff:
      sprintf(returnstr,"RESET KEYBOARD");
    }
  }
  return;
}

Assistant:

void PS2KeyboardAnalyzerResults::GetCommandName( char returnstr[], U64 code, double DeviceType )
{
    if( DeviceType == 0 )
    {
        switch( code )
        {
        case CMD_WRITE_LEDS:
            sprintf( returnstr, "SET LEDs" );
            break;
        case CMD_ECHO:
            sprintf( returnstr, "SEND ECHO" );
            break;
        case CMD_SET_SCANCODE_SET:
            sprintf( returnstr, "SET SCANCODE" );
            break;
        case CMD_READ_ID:
            sprintf( returnstr, "READ DEVICE ID" );
            break;
        case CMD_SET_REPEAT:
            sprintf( returnstr, "SET REPEAT" );
            break;
        case CMD_KEYBOARD_ENABLE:
            sprintf( returnstr, "KEYBOARD ENABLE" );
            break;
        case CMD_KEYBOARD_DISABLE:
            sprintf( returnstr, "KEYBOARD DISABLE" );
            break;
        case CMD_SET_DEFAULTS:
            sprintf( returnstr, "SET DEFAULTS" );
            break;
        case CMD_SET_ALL_KEYS_REPEAT:
            sprintf( returnstr, "SET ALL KEYS REPEAT CODES" );
            break;
        case CMD_SET_ALL_KEYS_MAKEBREAK_CODES:
            sprintf( returnstr, "SET ALL KEYS MAKE, BREAK CODES" );
            break;
        case CMD_SET_ALL_KEYS_MAKE_CODES:
            sprintf( returnstr, "SET ALL KEYS MAKE CODES ONLY" );
            break;
        case CMD_SET_ALL_REPEAT_AND_MAKEBREAK_CODES:
            sprintf( returnstr, "SET ALL KEYS MAKE, BREAK, REPEAT CODES" );
            break;
        case CMD_SET_SINGLE_REPEAT:
            sprintf( returnstr, "SET KEY REPEAT CODES" );
            break;
        case CMD_SET_SINGLE_MAKEBREAK_CODES:
            sprintf( returnstr, "SET KEY MAKE, BREAK CODES" );
            break;
        case CMD_SET_SINGLE_MAKE_CODES:
            sprintf( returnstr, "SET KEY MAKE CODES ONLY" );
            break;
        case CMD_RESEND:
            sprintf( returnstr, "RESEND LAST DATA" );
            break;
        case CMD_KEYBOARD_RESET:
            sprintf( returnstr, "RESET KEYBOARD" );
            break;
        default:
            sprintf( returnstr, "DATA FRAME" );
        }
    }
    else
    {
        switch( code )
        {
        case MOUSE_CMD_SET_SCALING2to1:
            sprintf( returnstr, "SET SCALING TO 2:1" );
            break;
        case MOUSE_CMD_SET_SCALING1to1:
            sprintf( returnstr, "SET SCALING 1:1" );
            break;
        case MOUSE_CMD_SET_RESOLUTION:
            sprintf( returnstr, "SET RESOLUTION" );
            break;
        case MOUSE_CMD_STATUS_REQUEST:
            sprintf( returnstr, "STATUS REQUEST" );
            break;
        case MOUSE_CMD_SET_STREAM_MODE:
            sprintf( returnstr, "SET STREAM MODE" );
            break;
        case MOUSE_CMD_READ_DATA:
            sprintf( returnstr, "READ DATA" );
            break;
        case MOUSE_CMD_RESET_WRAP_MODE:
            sprintf( returnstr, "RESET WRAP MODE" );
            break;
        case MOUSE_CMD_SET_WRAP_MODE:
            sprintf( returnstr, "SET WRAP MODE" );
            break;
        case MOUSE_CMD_SET_REMOTE_MODE:
            sprintf( returnstr, "SET REMOTE MODE" );
            break;
        case MOUSE_CMD_GET_DEVICE_ID:
            sprintf( returnstr, "GET DEVICE ID" );
            break;
        case MOUSE_CMD_SET_SAMPLE_RATE:
            sprintf( returnstr, "SET SAMPLE RATE" );
            break;
        case MOUSE_CMD_ENABLE_DATA_REPORTING:
            sprintf( returnstr, "ENABLE DATA REPORTING" );
            break;
        case MOUSE_CMD_DISABLE_DATA_REPORTING:
            sprintf( returnstr, "DISABLE DATA REPORTING" );
            break;
        case MOUSE_CMD_SET_DEFAULTS:
            sprintf( returnstr, "SET DEFAULTS" );
            break;
        case MOUSE_CMD_RESEND:
            sprintf( returnstr, "RESEND" );
            break;
        case MOUSE_CMD_RESET:
            sprintf( returnstr, "RESET MOUSE" );
            break;
        default:
            sprintf( returnstr, "DATA FRAME" );
        }
    }
}